

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setiter(ident *id,int i,identstack *stack)

{
  undefined1 local_30 [8];
  tagval zero;
  identstack *stack_local;
  int i_local;
  ident *id_local;
  
  zero._8_8_ = stack;
  if (i == 0) {
    tagval::setint((tagval *)local_30,0);
    pusharg(id,(tagval *)local_30,(identstack *)zero._8_8_);
    id->flags = id->flags & 0xffffffdf;
  }
  else {
    if ((id->field_2).minval != 1) {
      if (((id->field_2).minval == 3) && ((id->field_4).args != (char *)0x0)) {
        operator_delete__((id->field_4).args);
      }
      cleancode(id);
      (id->field_2).minval = 1;
    }
    *(int *)&id->field_4 = i;
  }
  return;
}

Assistant:

static inline void setiter(ident &id, int i, identstack &stack)
{
    if(i)
    {
        if(id.valtype != VAL_INT)
        {
            if(id.valtype == VAL_STR) delete[] id.val.s;
            cleancode(id);
            id.valtype = VAL_INT;
        }
        id.val.i = i;
    }
    else
    {
        tagval zero;
        zero.setint(0);
        pusharg(id, zero, stack);
        id.flags &= ~IDF_UNKNOWN;
    }
}